

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtabbar_p.h
# Opt level: O3

void __thiscall QTabBarPrivate::Tab::startAnimation(Tab *this,QTabBarPrivate *priv,int duration)

{
  long *plVar1;
  QWidget *this_00;
  TabBarAnimation *pTVar2;
  long lVar3;
  int iVar4;
  QStyle *pQVar5;
  TabBarAnimation *pTVar6;
  long lVar7;
  long in_FS_OFFSET;
  QVariant QStack_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&(priv->super_QWidgetPrivate).field_0x8;
  pQVar5 = QWidget::style(this_00);
  iVar4 = (**(code **)(*(long *)pQVar5 + 0xf0))(pQVar5,0x71,0,this_00,0);
  if (iVar4 < 1) {
    lVar3 = (priv->tabList).d.size;
    if (lVar3 == 0) {
LAB_00490dc1:
      iVar4 = -1;
    }
    else {
      iVar4 = -1;
      lVar7 = 0;
      do {
        if (lVar3 << 3 == lVar7) goto LAB_00490dc1;
        iVar4 = iVar4 + 1;
        plVar1 = (long *)((long)(priv->tabList).d.ptr + lVar7);
        lVar7 = lVar7 + 8;
      } while ((Tab *)*plVar1 != this);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      moveTabFinished(priv,iVar4);
      return;
    }
  }
  else {
    pTVar6 = (this->animation)._M_t.
             super___uniq_ptr_impl<QTabBarPrivate::Tab::TabBarAnimation,_std::default_delete<QTabBarPrivate::Tab::TabBarAnimation>_>
             ._M_t.
             super__Tuple_impl<0UL,_QTabBarPrivate::Tab::TabBarAnimation_*,_std::default_delete<QTabBarPrivate::Tab::TabBarAnimation>_>
             .super__Head_base<0UL,_QTabBarPrivate::Tab::TabBarAnimation_*,_false>._M_head_impl;
    if (pTVar6 == (TabBarAnimation *)0x0) {
      pTVar6 = (TabBarAnimation *)operator_new(0x20);
      TabBarAnimation::TabBarAnimation(pTVar6,this,priv);
      pTVar2 = (this->animation)._M_t.
               super___uniq_ptr_impl<QTabBarPrivate::Tab::TabBarAnimation,_std::default_delete<QTabBarPrivate::Tab::TabBarAnimation>_>
               ._M_t.
               super__Tuple_impl<0UL,_QTabBarPrivate::Tab::TabBarAnimation_*,_std::default_delete<QTabBarPrivate::Tab::TabBarAnimation>_>
               .super__Head_base<0UL,_QTabBarPrivate::Tab::TabBarAnimation_*,_false>._M_head_impl;
      (this->animation)._M_t.
      super___uniq_ptr_impl<QTabBarPrivate::Tab::TabBarAnimation,_std::default_delete<QTabBarPrivate::Tab::TabBarAnimation>_>
      ._M_t.
      super__Tuple_impl<0UL,_QTabBarPrivate::Tab::TabBarAnimation_*,_std::default_delete<QTabBarPrivate::Tab::TabBarAnimation>_>
      .super__Head_base<0UL,_QTabBarPrivate::Tab::TabBarAnimation_*,_false>._M_head_impl = pTVar6;
      if (pTVar2 != (TabBarAnimation *)0x0) {
        (**(code **)(*(long *)pTVar2 + 0x20))();
        pTVar6 = (this->animation)._M_t.
                 super___uniq_ptr_impl<QTabBarPrivate::Tab::TabBarAnimation,_std::default_delete<QTabBarPrivate::Tab::TabBarAnimation>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_QTabBarPrivate::Tab::TabBarAnimation_*,_std::default_delete<QTabBarPrivate::Tab::TabBarAnimation>_>
                 .super__Head_base<0UL,_QTabBarPrivate::Tab::TabBarAnimation_*,_false>._M_head_impl;
      }
    }
    ::QVariant::QVariant(&QStack_48,this->dragOffset);
    QVariantAnimation::setStartValue((QVariant *)pTVar6);
    ::QVariant::~QVariant(&QStack_48);
    pTVar6 = (this->animation)._M_t.
             super___uniq_ptr_impl<QTabBarPrivate::Tab::TabBarAnimation,_std::default_delete<QTabBarPrivate::Tab::TabBarAnimation>_>
             ._M_t.
             super__Tuple_impl<0UL,_QTabBarPrivate::Tab::TabBarAnimation_*,_std::default_delete<QTabBarPrivate::Tab::TabBarAnimation>_>
             .super__Head_base<0UL,_QTabBarPrivate::Tab::TabBarAnimation_*,_false>._M_head_impl;
    ::QVariant::QVariant(&QStack_48,0);
    QVariantAnimation::setEndValue((QVariant *)pTVar6);
    ::QVariant::~QVariant(&QStack_48);
    QVariantAnimation::setDuration
              ((int)(this->animation)._M_t.
                    super___uniq_ptr_impl<QTabBarPrivate::Tab::TabBarAnimation,_std::default_delete<QTabBarPrivate::Tab::TabBarAnimation>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_QTabBarPrivate::Tab::TabBarAnimation_*,_std::default_delete<QTabBarPrivate::Tab::TabBarAnimation>_>
                    .super__Head_base<0UL,_QTabBarPrivate::Tab::TabBarAnimation_*,_false>.
                    _M_head_impl);
    QAbstractAnimation::start
              ((DeletionPolicy)
               (this->animation)._M_t.
               super___uniq_ptr_impl<QTabBarPrivate::Tab::TabBarAnimation,_std::default_delete<QTabBarPrivate::Tab::TabBarAnimation>_>
               ._M_t.
               super__Tuple_impl<0UL,_QTabBarPrivate::Tab::TabBarAnimation_*,_std::default_delete<QTabBarPrivate::Tab::TabBarAnimation>_>
               .super__Head_base<0UL,_QTabBarPrivate::Tab::TabBarAnimation_*,_false>._M_head_impl);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

void startAnimation(QTabBarPrivate *priv, int duration) {
            if (!priv->isAnimated()) {
                priv->moveTabFinished(priv->tabList.indexOf(this));
                return;
            }
            if (!animation)
                animation = std::make_unique<TabBarAnimation>(this, priv);
            animation->setStartValue(dragOffset);
            animation->setEndValue(0);
            animation->setDuration(duration);
            animation->start();
        }